

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t>::
iu_StrCaseTest_x_iutest_x_NeString_Test(iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t> *this)

{
  iu_StrCaseTest_x_iutest_x_NeString_Test<wchar_t> *this_local;
  
  StrCaseTest<wchar_t>::StrCaseTest(&this->super_StrCaseTest<wchar_t>);
  (this->super_StrCaseTest<wchar_t>).super_StrTest<wchar_t>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_StrCaseTest_x_iutest_x_NeString_Test_00626f88;
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, NeString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String host = TestFixture::Text::host;
    IUTEST_INFORM_STRCASENE(host, TestFixture::Text::test);
    IUTEST_INFORM_STRCASENE(host, test);
    IUTEST_INFORM_STRCASENE(TestFixture::Text::test, host);

    IUTEST_EXPECT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASENE(host, test);
    IUTEST_EXPECT_STRCASENE(TestFixture::Text::test, host);

    IUTEST_ASSERT_STRCASENE(host, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASENE(host, test);
    IUTEST_ASSERT_STRCASENE(TestFixture::Text::test, host);
}